

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::SingleVertexArrayOutputTypeTests::init
          (SingleVertexArrayOutputTypeTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  OutputType outputType_;
  Storage storage_;
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  int iVar1;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc;
  GLValue GVar2;
  GLValue GVar3;
  undefined1 local_110 [8];
  string name;
  undefined1 local_e0 [8];
  Spec spec;
  undefined4 uStack_a4;
  undefined1 local_98 [8];
  ArraySpec arraySpec;
  int local_50;
  int countNdx;
  int componentCount;
  int storageNdx;
  int outputTypeNdx;
  int inputTypeNdx;
  int counts [2];
  Storage storages [1];
  OutputType outputTypes [3];
  InputType inputTypes [6];
  SingleVertexArrayOutputTypeTests *this_local;
  
  outputTypes[1] = OUTPUTTYPE_FLOAT;
  outputTypes[2] = OUTPUTTYPE_INT;
  stack0xffffffffffffffcc = 0x200000001;
  outputTypes[0] = OUTPUTTYPE_VEC4;
  memset(counts,0,4);
  _outputTypeNdx = 0x10000000001;
  storageNdx = 0;
  iVar1 = 1;
  while (storageNdx < 6) {
    for (componentCount = 0; componentCount < 3; componentCount = componentCount + 1) {
      for (countNdx = 0; countNdx < 1; countNdx = countNdx + 1) {
        for (local_50 = 2; local_50 < 5; local_50 = local_50 + 1) {
          for (arraySpec.max.field_1._4_4_ = 0; (int)arraySpec.max.field_1._4_4_ < 2;
              arraySpec.max.field_1._4_4_ = arraySpec.max.field_1._4_4_ + 1) {
            type = outputTypes[(long)storageNdx + 1];
            outputType_ = counts[(long)componentCount + 1];
            storage_ = counts[countNdx];
            GVar2 = deqp::gls::GLValue::getMinValue(type);
            GVar3 = deqp::gls::GLValue::getMaxValue(outputTypes[(long)storageNdx + 1]);
            spec.arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = GVar3.type;
            max_._4_4_ = spec.arrays.
                         super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            max_.type = (InputType)
                        spec.arrays.
                        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            min_._4_4_ = uStack_a4;
            min_.type = GVar2.type;
            min_.field_1 = GVar2.field_1;
            max_.field_1 = GVar3.field_1;
            deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                      ((ArraySpec *)local_98,type,outputType_,storage_,USAGE_DYNAMIC_DRAW,local_50,0
                       ,0,false,min_,max_);
            deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_e0);
            local_e0._0_4_ = PRIMITIVE_TRIANGLES;
            local_e0._4_4_ = (&outputTypeNdx)[(int)arraySpec.max.field_1._4_4_];
            spec.primitive = PRIMITIVE_POINTS;
            std::
            vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                         *)&spec.first,(ArraySpec *)local_98);
            deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_
                      ((string *)local_110,(Spec *)local_e0);
            this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
            testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            renderCtx = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
            name_00 = (char *)std::__cxx11::string::c_str();
            desc = (char *)std::__cxx11::string::c_str();
            deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                      (this_00,testCtx,renderCtx,(Spec *)local_e0,name_00,desc);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
            std::__cxx11::string::~string((string *)local_110);
            deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_e0);
          }
        }
      }
    }
    storageNdx = storageNdx + 1;
    iVar1 = storageNdx;
  }
  return iVar1;
}

Assistant:

void SingleVertexArrayOutputTypeTests::init (void)
{
	// Test output types with different input types, component counts and storage, Usage?, Precision?, float?
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_UNSIGNED_SHORT, Array::INPUTTYPE_UNSIGNED_BYTE, Array::INPUTTYPE_FIXED};
	Array::OutputType	outputTypes[]	= {Array::OUTPUTTYPE_VEC2, Array::OUTPUTTYPE_VEC3, Array::OUTPUTTYPE_VEC4};
	Array::Storage		storages[]		= {Array::STORAGE_USER};
	int					counts[]		= {1, 256};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int outputTypeNdx = 0; outputTypeNdx < DE_LENGTH_OF_ARRAY(outputTypes); outputTypeNdx++)
		{
			for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
			{
				for (int componentCount = 2; componentCount < 5; componentCount++)
				{
					for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
					{
						MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																		outputTypes[outputTypeNdx],
																		storages[storageNdx],
																		Array::USAGE_DYNAMIC_DRAW,
																		componentCount,
																		0,
																		0,
																		false,
																		GLValue::getMinValue(inputTypes[inputTypeNdx]),
																		GLValue::getMaxValue(inputTypes[inputTypeNdx]));

						MultiVertexArrayTest::Spec spec;
						spec.primitive	= Array::PRIMITIVE_TRIANGLES;
						spec.drawCount	= counts[countNdx];
						spec.first		= 0;
						spec.arrays.push_back(arraySpec);

						std::string name = spec.getName();
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
					}
				}
			}
		}
	}
}